

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  Vec3 *w;
  float fVar1;
  float fVar2;
  ReferenceParams *pRVar3;
  bool bVar4;
  Vec3 *s;
  int faceSize;
  int lodOffsNdx;
  int y;
  long lVar5;
  Vec3 *s_00;
  int z;
  ulong uVar6;
  Vec3 *s_01;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float wy;
  float ny;
  float fVar12;
  float fVar13;
  float fVar14;
  float width;
  float height;
  Vec3 coordDyo;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 coord;
  Vec2 lodBounds;
  Vec2 clampedLod;
  Vec3 coordO;
  Vec4 resPix;
  Vec4 refPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodO;
  Vec2 lodBias;
  int local_1ac;
  Vec3 local_190;
  Vector<float,_3> local_180;
  Vector<float,_3> local_170;
  Vec3 local_164;
  PixelBufferAccess *local_158;
  ulong local_150;
  Vector<float,_2> local_148;
  float local_13c;
  float local_138;
  Vec3 local_134;
  Vec4 local_128;
  undefined1 local_118 [20];
  float local_104 [2];
  float local_fc;
  Vec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  Vec3 local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  Sampler *local_98;
  TextureCubeView *local_90;
  ReferenceParams *local_88;
  ConstPixelBufferAccess *local_80;
  tcu local_78 [8];
  Vector<float,_2> local_70;
  float local_68 [8];
  Vec3 local_48;
  float fStack_3c;
  undefined8 local_38;
  
  local_b8.m_data[0] = *texCoord;
  local_d8.m_data[0] = texCoord[1];
  local_b8.m_data[1] = texCoord[3];
  local_b8.m_data[2] = texCoord[6];
  local_ac = texCoord[9];
  local_d8.m_data[1] = texCoord[4];
  local_d8.m_data[2] = texCoord[7];
  local_cc = texCoord[10];
  local_f8.m_data[0] = texCoord[2];
  local_f8.m_data[1] = texCoord[5];
  local_f8.m_data[2] = texCoord[8];
  local_ec = texCoord[0xb];
  if (src->m_numLevels < 1) {
    faceSize = 0;
  }
  else {
    faceSize = (src->m_levels[0]->m_size).m_data[0];
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_48.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_48.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_48.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_3c = (sampleParams->super_RenderParams).w.m_data[3];
  local_38 = CONCAT44(local_48.m_data[1],local_48.m_data[2]);
  local_70.m_data[0] = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_70.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_68[0] = -1.0;
  local_68[1] = 0.0;
  local_68[2] = 1.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = -1.0;
  local_68[6] = 0.0;
  local_68[7] = 1.0;
  local_118._16_4_ = -1.7146522e+38;
  local_158 = errorMask;
  local_e8 = local_f8.m_data[2];
  local_e4 = local_f8.m_data[1];
  local_c8 = local_d8.m_data[2];
  local_c4 = local_d8.m_data[1];
  local_a8 = local_b8.m_data[2];
  local_a4 = local_b8.m_data[1];
  local_80 = reference;
  local_70.m_data[1] = local_70.m_data[0];
  tcu::RGBA::toVec((RGBA *)(local_118 + 0x10));
  tcu::clear(local_158,(Vec4 *)local_118);
  local_98 = &sampleParams->sampler;
  local_1ac = 0;
  uVar6 = 0;
  local_90 = src;
  local_88 = sampleParams;
  while ((int)uVar6 < (result->m_size).m_data[1]) {
    wy = (float)(int)uVar6 + 0.5;
    fVar12 = wy / height;
    local_138 = height - wy;
    local_13c = 1.0 - fVar12;
    local_150 = uVar6;
    for (y = 0; z = (int)uVar6, y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_118,(int)result,y,z);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_118 + 0x10),(int)local_80,y,z);
      local_170.m_data[0] = local_104[0];
      local_170.m_data[1] = local_104[1];
      local_170.m_data[2] = local_fc;
      local_180.m_data[0] = (float)local_118._4_4_;
      local_180.m_data[1] = (float)local_118._8_4_;
      local_180.m_data[2] = (float)local_118._12_4_;
      tcu::operator-((tcu *)&local_164,&local_170,&local_180);
      tcu::abs<float,3>((tcu *)&local_128,(Vector<float,_3> *)&local_164);
      tcu::lessThanEqual<float,3>
                ((tcu *)&local_134,(Vector<float,_3> *)&local_128,nonShadowThreshold);
      bVar4 = tcu::boolAll<3>((Vector<bool,_3> *)&local_134);
      if (bVar4) {
        if (((float)local_118._0_4_ != (float)local_118._16_4_) ||
           (uVar6 = local_150, NAN((float)local_118._0_4_) || NAN((float)local_118._16_4_))) {
          fVar14 = (float)y + 0.5;
          fVar13 = fVar14 / width;
          bVar4 = 1.0 <= fVar12 + fVar13;
          fVar11 = fVar12;
          fVar1 = fVar14;
          fVar2 = wy;
          if (bVar4) {
            fVar13 = 1.0 - fVar13;
            fVar11 = local_13c;
            fVar1 = width - fVar14;
            fVar2 = local_138;
          }
          s = &local_b8 + bVar4;
          w = &local_48 + bVar4;
          fVar9 = projectedTriInterpolate(s,w,fVar13,fVar11);
          s_01 = &local_d8 + bVar4;
          fVar10 = projectedTriInterpolate(s_01,w,fVar13,fVar11);
          s_00 = &local_f8 + bVar4;
          local_164.m_data[2] = projectedTriInterpolate(s_00,w,fVar13,fVar11);
          local_164.m_data[0] = fVar9;
          local_164.m_data[1] = fVar10;
          fVar9 = triDerivateX(s,w,fVar14,width,fVar11);
          fVar10 = triDerivateX(s_01,w,fVar14,width,fVar11);
          local_170.m_data[2] = triDerivateX(s_00,w,fVar14,width,fVar11);
          local_170.m_data[1] = fVar10;
          local_170.m_data[0] = fVar9;
          fVar11 = triDerivateY(s,w,wy,height,fVar13);
          fVar14 = triDerivateY(s_01,w,wy,height,fVar13);
          local_180.m_data[2] = triDerivateY(s_00,w,wy,height,fVar13);
          local_180.m_data[1] = fVar14;
          local_180.m_data[0] = fVar11;
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&local_148,&local_164,&local_170,&local_180,faceSize,lodPrec);
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            fVar11 = local_68[lVar5 * 2] + fVar1;
            fVar10 = local_68[lVar5 * 2 + 1] + fVar2;
            fVar13 = fVar11 / width;
            ny = fVar10 / height;
            fVar14 = projectedTriInterpolate(s,w,fVar13,ny);
            fVar9 = projectedTriInterpolate(s_01,w,fVar13,ny);
            local_128.m_data[2] = projectedTriInterpolate(s_00,w,fVar13,ny);
            local_128.m_data[0] = fVar14;
            local_128.m_data[1] = fVar9;
            fVar14 = triDerivateX(s,w,fVar11,width,ny);
            fVar9 = triDerivateX(s_01,w,fVar11,width,ny);
            local_134.m_data[2] = triDerivateX(s_00,w,fVar11,width,ny);
            local_134.m_data[0] = fVar14;
            local_134.m_data[1] = fVar9;
            fVar11 = triDerivateY(s,w,fVar10,height,fVar13);
            fVar14 = triDerivateY(s_01,w,fVar10,height,fVar13);
            local_190.m_data[2] = triDerivateY(s_00,w,fVar10,height,fVar13);
            local_190.m_data[1] = fVar14;
            local_190.m_data[0] = fVar11;
            tcu::computeCubeLodBoundsFromDerivates
                      (local_78,(Vec3 *)&local_128,&local_134,&local_190,faceSize,lodPrec);
            uVar7 = -(uint)(local_148.m_data[0] <= local_78._0_4_);
            uVar8 = -(uint)(local_78._4_4_ <= local_148.m_data[1]);
            local_148.m_data[0] =
                 (float)(~uVar7 & (uint)local_78._0_4_ | (uint)local_148.m_data[0] & uVar7);
            local_148.m_data[1] =
                 (float)(~uVar8 & (uint)local_78._4_4_ | (uint)local_148.m_data[1] & uVar8);
          }
          tcu::operator+(&local_148,&local_70);
          pRVar3 = local_88;
          local_190.m_data[0] = local_88->minLod;
          local_190.m_data[1] = local_88->maxLod;
          tcu::clampLodBounds((tcu *)&local_134,(Vec2 *)&local_128,(Vec2 *)&local_190,lodPrec);
          bVar4 = tcu::isTexCompareResultValid
                            (local_90,local_98,comparePrec,&local_164,(Vec2 *)&local_134,
                             (pRVar3->super_RenderParams).ref,(float)local_118._0_4_);
          uVar6 = local_150;
          if (!bVar4) {
            local_190.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_190);
            tcu::PixelBufferAccess::setPixel(local_158,&local_128,y,(int)local_150,0);
            local_1ac = local_1ac + 1;
            uVar6 = local_150;
          }
        }
      }
      else {
        local_164.m_data[0] = -1.7014636e+38;
        tcu::RGBA::toVec((RGBA *)&local_164);
        tcu::PixelBufferAccess::setPixel(local_158,&local_128,y,z,0);
        local_1ac = local_1ac + 1;
      }
    }
    uVar6 = (ulong)(z + 1);
  }
  return local_1ac;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::TextureCubeView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const int			srcSize			= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
				const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

				tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
					const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
					const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
					const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}